

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

void __thiscall
Units_hasUnlinkedUnitsLayeredComponentsWithVariables_Test::TestBody
          (Units_hasUnlinkedUnitsLayeredComponentsWithVariables_Test *this)

{
  element_type *peVar1;
  AssertHelper local_e0 [8];
  Message local_d8 [8];
  char *local_d0 [4];
  UnitsPtr u1;
  ComponentPtr c3;
  ComponentPtr c2;
  ComponentPtr c1;
  ModelPtr m;
  AssertionResult gtest_ar_;
  VariablePtr v4;
  VariablePtr v3;
  VariablePtr v2;
  VariablePtr v1;
  
  libcellml::Model::create();
  libcellml::Component::create();
  libcellml::Component::create();
  libcellml::Component::create();
  libcellml::Units::create();
  libcellml::Variable::create();
  libcellml::Variable::create();
  libcellml::Variable::create();
  libcellml::Variable::create();
  peVar1 = u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_d0,"a_unit",(allocator<char> *)&gtest_ar_);
  libcellml::NamedEntity::setName((string *)peVar1);
  std::__cxx11::string::~string((string *)local_d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_d0,"second",(allocator<char> *)&gtest_ar_);
  libcellml::Units::addUnit
            ((string *)u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__cxx11::string::~string((string *)local_d0);
  libcellml::Variable::setUnits
            ((shared_ptr *)
             v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Variable::setUnits
            ((shared_ptr *)
             v3.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Component::addVariable
            ((shared_ptr *)
             c1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Component::addVariable
            ((shared_ptr *)
             c2.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Component::addVariable
            ((shared_ptr *)
             c3.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Component::addVariable
            ((shared_ptr *)
             c3.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::ComponentEntity::addComponent
            ((shared_ptr *)
             c2.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::ComponentEntity::addComponent
            ((shared_ptr *)
             c1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::ComponentEntity::addComponent
            ((shared_ptr *)m.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            );
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_d0,"a_unit",(allocator<char> *)&gtest_ar_);
  libcellml::Variable::setUnits
            ((string *)v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            );
  std::__cxx11::string::~string((string *)local_d0);
  libcellml::Model::addUnits
            ((shared_ptr *)m.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            );
  libcellml::Variable::setUnits
            ((shared_ptr *)
             v4.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  gtest_ar_.success_ = (bool)libcellml::Model::hasUnlinkedUnits();
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (gtest_ar_.success_ == false) {
    testing::Message::Message(local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_d0,&gtest_ar_.success_,"m->hasUnlinkedUnits()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x1e6,local_d0[0]);
    testing::internal::AssertHelper::operator=(local_e0,local_d8);
    testing::internal::AssertHelper::~AssertHelper(local_e0);
    std::__cxx11::string::~string((string *)local_d0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_d8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&v4.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&v3.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&c3.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&c2.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&c1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&m.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Units, hasUnlinkedUnitsLayeredComponentsWithVariables)
{
    libcellml::ModelPtr m = libcellml::Model::create();
    libcellml::ComponentPtr c1 = libcellml::Component::create();
    libcellml::ComponentPtr c2 = libcellml::Component::create();
    libcellml::ComponentPtr c3 = libcellml::Component::create();
    libcellml::UnitsPtr u1 = libcellml::Units::create();
    libcellml::VariablePtr v1 = libcellml::Variable::create();
    libcellml::VariablePtr v2 = libcellml::Variable::create();
    libcellml::VariablePtr v3 = libcellml::Variable::create();
    libcellml::VariablePtr v4 = libcellml::Variable::create();

    u1->setName("a_unit");
    u1->addUnit("second");

    v2->setUnits(u1);
    v3->setUnits(u1);

    c1->addVariable(v1);
    c2->addVariable(v2);
    c3->addVariable(v3);
    c3->addVariable(v4);

    c2->addComponent(c3);
    c1->addComponent(c2);
    m->addComponent(c1);

    v1->setUnits("a_unit");
    m->addUnits(u1);
    v4->setUnits(u1);

    EXPECT_TRUE(m->hasUnlinkedUnits());
}